

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_22::Struct2Local::visitRefAs(Struct2Local *this,RefAs *curr)

{
  ParentChildInteraction PVar1;
  RefAs *curr_local;
  Struct2Local *this_local;
  
  PVar1 = EscapeAnalyzer::getInteraction(this->analyzer,(Expression *)curr);
  if (PVar1 != None) {
    if (curr->op != RefAsNonNull) {
      __assert_fail("curr->op == RefAsNonNull",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                    ,0x323,"void wasm::(anonymous namespace)::Struct2Local::visitRefAs(RefAs *)");
    }
    replaceCurrent(this,curr->value);
  }
  return;
}

Assistant:

void visitRefAs(RefAs* curr) {
    if (analyzer.getInteraction(curr) == ParentChildInteraction::None) {
      return;
    }

    // It is safe to optimize out this RefAsNonNull, since we proved it
    // contains our allocation, and so cannot trap.
    assert(curr->op == RefAsNonNull);
    replaceCurrent(curr->value);
  }